

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ValueBytes(sqlite3_value *pVal,u8 enc)

{
  ushort uVar1;
  int iVar2;
  
  uVar1 = pVal->flags;
  if (((uVar1 & 2) != 0) && ((pVal->enc == enc || (pVal->enc != '\x01' && enc != '\x01')))) {
    return pVal->n;
  }
  if ((uVar1 & 0x10) == 0) {
    iVar2 = 0;
    if ((uVar1 & 1) == 0) {
      iVar2 = valueBytes(pVal,enc);
      return iVar2;
    }
  }
  else {
    iVar2 = pVal->n;
    if ((uVar1 >> 10 & 1) != 0) {
      return iVar2 + (pVal->u).nZero;
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ValueBytes(sqlite3_value *pVal, u8 enc){
  Mem *p = (Mem*)pVal;
  assert( (p->flags & MEM_Null)==0 || (p->flags & (MEM_Str|MEM_Blob))==0 );
  if( (p->flags & MEM_Str)!=0 && pVal->enc==enc ){
    return p->n;
  }
  if( (p->flags & MEM_Str)!=0 && enc!=SQLITE_UTF8 && pVal->enc!=SQLITE_UTF8 ){
    return p->n;
  }
  if( (p->flags & MEM_Blob)!=0 ){
    if( p->flags & MEM_Zero ){
      return p->n + p->u.nZero;
    }else{
      return p->n;
    }
  }
  if( p->flags & MEM_Null ) return 0;
  return valueBytes(pVal, enc);
}